

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GUIAbout.cpp
# Opt level: O2

void __thiscall GUIAbout::GUIAbout(GUIAbout *this)

{
  QTextDocument *this_00;
  QTextBrowser *this_01;
  WidgetAttribute WVar1;
  QVBoxLayout layout;
  QString html;
  
  QDialog::QDialog(&this->super_QDialog,0,0);
  *(undefined ***)this = &PTR_metaObject_00122ae8;
  *(undefined ***)&this->field_0x10 = &PTR__GUIAbout_00122cc0;
  QDialog::setModal(SUB81(this,0));
  WVar1 = (WidgetAttribute)this;
  QWidget::setMinimumSize(WVar1,500);
  QWidget::setMaximumSize(WVar1,500);
  QString::QString((QString *)&layout," ");
  QWidget::setWindowTitle((QString *)this);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&layout);
  QWidget::setAttribute(WVar1,true);
  QVBoxLayout::QVBoxLayout(&layout,(QWidget *)this);
  html.d.d = (Data *)0x0;
  html.d.ptr = (char16_t *)0x0;
  html.d.size = 0;
  QString::append(&html,"<br/><pre>  Author:       Przemyslaw Madej</pre>");
  QString::append(&html,"<pre>  Web page:     http://przemeknet.pl/fifteen.html</pre>");
  this_00 = (QTextDocument *)operator_new(0x10);
  QTextDocument::QTextDocument(this_00,(QObject *)this);
  QTextDocument::setHtml((QString *)this_00);
  this_01 = (QTextBrowser *)operator_new(0x28);
  QTextBrowser::QTextBrowser(this_01,(QWidget *)this);
  QTextEdit::setDocument((QTextDocument *)this_01);
  QBoxLayout::addWidget(&layout,this_01,0,0);
  QWidget::show();
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&html.d);
  QVBoxLayout::~QVBoxLayout(&layout);
  return;
}

Assistant:

GUIAbout::GUIAbout()
{
    setModal( true );
    setMinimumSize( 500, 170 );
    setMaximumSize( 500, 170 );
    setWindowTitle( " " );
    setAttribute( Qt::WA_DeleteOnClose );

    QVBoxLayout layout( this );
    QString html;

    html.append( "<br/><pre>  Author:       Przemyslaw Madej</pre>" );
    html.append( "<pre>  Web page:     http://przemeknet.pl/fifteen.html</pre>" );

    QTextDocument* doc = new QTextDocument( this );
    doc->setHtml( html );
    QTextBrowser* browser = new QTextBrowser( this );
    browser->setDocument( doc );
    layout.addWidget( browser );
    show();
}